

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void plot_vertical_tiles_common
               (tgestate_t *state,tileindex_t *vistiles,supertileindex_t *maptiles,uint8_t x,
               uint8_t *window)

{
  tile_t *ptVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  char cVar6;
  tile_t *ptVar7;
  uint8_t *puVar8;
  char cVar9;
  tileindex_t *ptVar10;
  byte *pbVar11;
  
  uVar2 = (state->map_position).y;
  ptVar10 = supertiles[*maptiles].tiles + (uVar2 * '\x04' & 0xc | x & 3);
  bVar3 = -uVar2 & 3;
  bVar4 = 4;
  if (bVar3 != 0) {
    bVar4 = bVar3;
  }
  check_map_buf(state);
  ptVar1 = (tile_t *)0x110998;
  do {
    bVar3 = *ptVar10;
    *vistiles = bVar3;
    ptVar7 = ptVar1;
    if ((byte)(*maptiles + 0x34) < 0xbf) {
      ptVar7 = (tile_t *)0x1102b8;
    }
    if (*maptiles < 0x2d) {
      ptVar7 = exterior_tiles;
    }
    lVar5 = 0;
    puVar8 = window;
    do {
      *puVar8 = ptVar7[bVar3].row[lVar5];
      puVar8 = puVar8 + state->columns;
      lVar5 = lVar5 + 1;
    } while ((char)lVar5 != '\b');
    window = window + state->window_buf_stride;
    ptVar10 = ptVar10 + 4;
    vistiles = vistiles + state->columns;
    bVar4 = bVar4 - 1;
  } while (bVar4 != 0);
  pbVar11 = maptiles + 7;
  cVar6 = '\x03';
  do {
    ptVar10 = supertiles[*pbVar11].tiles + ((ulong)x & 3);
    cVar9 = '\x04';
    do {
      bVar4 = *ptVar10;
      *vistiles = bVar4;
      ptVar7 = ptVar1;
      if ((byte)(*pbVar11 + 0x34) < 0xbf) {
        ptVar7 = (tile_t *)0x1102b8;
      }
      if (*pbVar11 < 0x2d) {
        ptVar7 = exterior_tiles;
      }
      lVar5 = 0;
      puVar8 = window;
      do {
        *puVar8 = ptVar7[bVar4].row[lVar5];
        puVar8 = puVar8 + state->columns;
        lVar5 = lVar5 + 1;
      } while ((char)lVar5 != '\b');
      window = window + state->window_buf_stride;
      vistiles = vistiles + state->columns;
      ptVar10 = ptVar10 + 4;
      cVar9 = cVar9 + -1;
    } while (cVar9 != '\0');
    pbVar11 = pbVar11 + 7;
    cVar6 = cVar6 + -1;
  } while (cVar6 != '\0');
  ptVar10 = supertiles[*pbVar11].tiles + ((ulong)x & 3);
  cVar6 = ((state->map_position).y & 3) + 1;
  do {
    bVar4 = *ptVar10;
    *vistiles = bVar4;
    ptVar7 = ptVar1;
    if ((byte)(*pbVar11 + 0x34) < 0xbf) {
      ptVar7 = (tile_t *)0x1102b8;
    }
    if (*pbVar11 < 0x2d) {
      ptVar7 = exterior_tiles;
    }
    lVar5 = 0;
    puVar8 = window;
    do {
      *puVar8 = ptVar7[bVar4].row[lVar5];
      puVar8 = puVar8 + state->columns;
      lVar5 = lVar5 + 1;
    } while ((char)lVar5 != '\b');
    window = window + state->window_buf_stride;
    ptVar10 = ptVar10 + 4;
    vistiles = vistiles + state->columns;
    cVar6 = cVar6 + -1;
  } while (cVar6 != '\0');
  return;
}

Assistant:

void plot_vertical_tiles_common(tgestate_t             *state,
                                tileindex_t            *vistiles,
                                const supertileindex_t *maptiles,
                                uint8_t                 x,
                                uint8_t                *window)
{
  /* Conv: self_A94D removed. */

  uint8_t            x_offset;  /* was $A94D */
  const tileindex_t *tiles;     /* was HL */  // pointer into supertile
  uint8_t            offset;    /* was A */
  uint8_t            iters;     /* was A */
  uint8_t            iters2;    /* was B' */ // FUTURE: merge with 'iters'

  assert(state != NULL);
  ASSERT_TILE_BUF_PTR_VALID(vistiles);
  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  // assert(x);
  ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

  x_offset = x & 3; // self modify (local)

  /* Initial edge. */

  ASSERT_MAP_POSITION_VALID(state->map_position);
  offset = (state->map_position.y & 3) * 4 + x_offset;

  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[offset];
  ASSERT_SUPERTILE_PTR_VALID(tiles);

  // 0,1,2,3 => 4,3,2,1
  iters = -((offset >> 2) & 3) & 3;
  if (iters == 0)
    iters = 4; // 1..4

  check_map_buf(state);

  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

    t = *vistiles = *tiles; // A = tile index
    window = plot_tile_then_advance(state, t, maptiles, window);
    tiles += 4; // supertile stride
    vistiles += state->columns;
  }
  while (--iters);

  maptiles += 7; // move to next row

  /* Middle loop. */

  iters2 = 3;
  do
  {
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    assert(*maptiles < supertileindex__LIMIT);
    tiles = &supertiles[*maptiles].tiles[x_offset]; // self modified by $A8F6

    iters = 4;
    do
    {
      tileindex_t t; /* was A */

      ASSERT_TILE_BUF_PTR_VALID(vistiles);
      ASSERT_SUPERTILE_PTR_VALID(tiles);
      ASSERT_MAP_BUF_PTR_VALID(maptiles);
      ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

      t = *vistiles = *tiles; // A = tile index
      window = plot_tile_then_advance(state, t, maptiles, window);
      vistiles += state->columns;
      tiles += 4; // supertile stride
    }
    while (--iters);

    maptiles += 7; // move to next row
  }
  while (--iters2);

  /* Trailing edge. */

  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[x_offset]; // x_offset = read of self modified instruction
  iters = (state->map_position.y & 3) + 1;
  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

    t = *vistiles = *tiles; // A = tile index
    window = plot_tile_then_advance(state, t, maptiles, window);
    tiles += 4; // supertile stride
    vistiles += state->columns;
  }
  while (--iters);
}